

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStaticESLibrary.cpp
# Opt level: O1

FunctionLibrary * eglu::createStaticESLibrary(void)

{
  StaticFunctionLibrary *this;
  
  this = (StaticFunctionLibrary *)operator_new(0x38);
  tcu::StaticFunctionLibrary::StaticFunctionLibrary(this,createStaticESLibrary::s_functions,0xf6);
  return &this->super_FunctionLibrary;
}

Assistant:

tcu::FunctionLibrary* createStaticESLibrary (void)
{
#if (STATIC_LIB == STATIC_LIB_NONE)
	return new tcu::StaticFunctionLibrary(DE_NULL, 0);
#else
	static const tcu::StaticFunctionLibrary::Entry s_functions[] =
	{
#if (STATIC_LIB == STATIC_LIB_ES30)
#	include "egluStaticES30Library.inl"
#elif (STATIC_LIB == STATIC_LIB_ES20)
#	include "egluStaticES20Library.inl"
#else
#	error "Unknown STATIC_LIB value"
#endif
	};

	return new tcu::StaticFunctionLibrary(&s_functions[0], DE_LENGTH_OF_ARRAY(s_functions));
#endif
}